

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O3

size_t __thiscall
MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::
commonPrefixSearch<MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::result_pair_type>
          (DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>> *this,
          key_type *key,result_pair_type *result,size_t result_len,size_t len,size_t node_pos)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  
  if (len == 0) {
    len = strlen(key);
    lVar3 = *(long *)this;
    uVar4 = *(uint *)(lVar3 + node_pos * 8);
    if (len == 0) {
      len = 0;
      sVar2 = 0;
      goto LAB_00129c2f;
    }
  }
  else {
    lVar3 = *(long *)this;
    uVar4 = *(uint *)(lVar3 + node_pos * 8);
  }
  sVar5 = 0;
  sVar2 = 0;
  do {
    uVar1 = *(uint *)(lVar3 + (ulong)uVar4 * 8);
    if ((int)uVar1 < 0 && uVar4 == *(uint *)(lVar3 + 4 + (ulong)uVar4 * 8)) {
      if (sVar2 < result_len) {
        result[sVar2].value = ~uVar1;
        result[sVar2].length = sVar5;
      }
      sVar2 = sVar2 + 1;
    }
    uVar6 = (ulong)((byte)key[sVar5] + uVar4 + 1);
    if (uVar4 != *(uint *)(lVar3 + 4 + uVar6 * 8)) {
      return sVar2;
    }
    sVar5 = sVar5 + 1;
    uVar4 = *(uint *)(lVar3 + uVar6 * 8);
  } while (len != sVar5);
LAB_00129c2f:
  uVar1 = *(uint *)(lVar3 + (ulong)uVar4 * 8);
  if ((int)uVar1 < 0 && uVar4 == *(uint *)(lVar3 + 4 + (ulong)uVar4 * 8)) {
    if (sVar2 < result_len) {
      result[sVar2].value = ~uVar1;
      result[sVar2].length = len;
    }
    sVar2 = sVar2 + 1;
  }
  return sVar2;
}

Assistant:

size_t commonPrefixSearch(const key_type *key,
                            T* result,
                            size_t result_len,
                            size_t len = 0,
                            size_t node_pos = 0) const {
    if (!len) len = length_func_()(key);

    register array_type_  b   = array_[node_pos].base;
    register size_t     num = 0;
    register array_type_  n;
    register array_u_type_ p;

    for (register size_t i = 0; i < len; ++i) {
      p = b;  // + 0;
      n = array_[p].base;
      if ((array_u_type_) b == array_[p].check && n < 0) {
        // result[num] = -n-1;
        if (num < result_len) set_result(result[num], -n-1, i);
        ++num;
      }

      p = b +(node_u_type_)(key[i]) + 1;
      if ((array_u_type_) b == array_[p].check)
        b = array_[p].base;
      else
        return num;
    }

    p = b;
    n = array_[p].base;

    if ((array_u_type_)b == array_[p].check && n < 0) {
      if (num < result_len) set_result(result[num], -n-1, len);
      ++num;
    }

    return num;
  }